

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

uint8_t __thiscall ymfm::ymf288::read_status_hi(ymf288 *this)

{
  byte bVar1;
  ymfm_interface *pyVar2;
  ulong uVar3;
  byte local_11;
  uint8_t status;
  ymf288 *this_local;
  
  bVar1 = fm_engine_base<ymfm::opn_registers_base<true>_>::status
                    ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  local_11 = bVar1 & 3 & (this->m_flag_control & 3 ^ 0xff);
  fm_engine_base<ymfm::opn_registers_base<true>_>::set_reset_status
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,local_11,local_11 ^ 0xff
            );
  pyVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::intf
                     ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  uVar3 = (*(code *)pyVar2->m_engine[4]._vptr_ymfm_engine_callbacks)();
  if ((uVar3 & 1) != 0) {
    local_11 = local_11 | 0x80;
  }
  return local_11;
}

Assistant:

uint8_t ymf288::read_status_hi()
{
	// fetch regular status
	uint8_t status = m_fm.status() & (fm_engine::STATUS_TIMERA | fm_engine::STATUS_TIMERB);

	// turn off any bits that have been requested to be masked
	status &= ~(m_flag_control & 0x03);

	// update the status so that IRQs are propagated
	m_fm.set_reset_status(status, ~status);

	// merge in the busy flag
	if (m_fm.intf().ymfm_is_busy())
		status |= fm_engine::STATUS_BUSY;
	return status;
}